

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O1

void __thiscall gnilk::LogManager::IterateLogs(LogManager *this,LogDelegate *cbInstance)

{
  int iVar1;
  undefined8 uVar2;
  mutex *__mutex;
  _Hash_node_base *p_Var3;
  shared_ptr<gnilk::Log> local_70;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>
  local_60;
  
  __mutex = &this->instLock;
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar1 != 0) {
LAB_00189949:
    uVar2 = std::__throw_system_error(iVar1);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar2);
  }
  p_Var3 = (this->logInstances)._M_h._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>
      ::pair(&local_60,
             (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gnilk::LogInstance>_>
              *)(p_Var3 + 1));
      local_70.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           ((local_60.second.super___shared_ptr<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->logger).super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_70.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           ((local_60.second.super___shared_ptr<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->logger).super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      if (local_70.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_70.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_70.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_70.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (local_70.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      if ((cbInstance->super__Function_base)._M_manager == (_Manager_type)0x0) {
        iVar1 = std::__throw_bad_function_call();
        goto LAB_00189949;
      }
      (*cbInstance->_M_invoker)((_Any_data *)cbInstance,&local_70);
      if (local_70.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_70.super___shared_ptr<gnilk::Log,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_60.second.super___shared_ptr<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.second.
                   super___shared_ptr<gnilk::LogInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60.first._M_dataplus._M_p != &local_60.first.field_2) {
        operator_delete(local_60.first._M_dataplus._M_p,
                        local_60.first.field_2._M_allocated_capacity + 1);
      }
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void LogManager::IterateLogs(const LogDelegate &cbInstance) {
    std::lock_guard<std::mutex> lock(instLock);
    for(auto [name, inst] : logInstances) {
        cbInstance(inst->GetLog());
    }
}